

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::SetImportDetailProperties
          (cmExportFileGenerator *this,string *config,string *suffix,cmGeneratorTarget *target,
          ImportPropertyMap *properties)

{
  cmAlphaNum *this_00;
  cmMakefile *this_01;
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  mapped_type *pmVar4;
  string *psVar5;
  allocator<char> local_2b9;
  string local_2b8;
  cmValue local_298;
  cmValue p;
  string propval;
  cmAlphaNum local_240;
  undefined1 local_210 [8];
  string prop_2;
  cmAlphaNum local_1d0;
  cmAlphaNum local_1a0;
  undefined1 local_170 [8];
  string prop_1;
  string local_148;
  size_type local_128;
  size_t oldMissingTargetsSize;
  string local_118;
  cmLinkInterface *local_f8;
  cmLinkInterface *iface;
  string local_d0 [39];
  allocator<char> local_a9;
  string local_a8;
  string local_78 [8];
  string value;
  string prop;
  cmMakefile *mf;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  string *suffix_local;
  string *config_local;
  cmExportFileGenerator *this_local;
  
  this_01 = target->Makefile;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (((TVar2 == SHARED_LIBRARY) ||
      (TVar2 = cmGeneratorTarget::GetType(target), TVar2 == MODULE_LIBRARY)) &&
     (bVar1 = cmGeneratorTarget::IsDLLPlatform(target), !bVar1)) {
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_78);
    bVar1 = cmGeneratorTarget::HasSOName(target,config);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_a9);
      bVar1 = cmMakefile::IsOn(this_01,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      if (bVar1) {
        (*this->_vptr_cmExportFileGenerator[0x14])(local_d0,this,target,config);
        std::__cxx11::string::operator=(local_78,local_d0);
        std::__cxx11::string::~string(local_d0);
      }
      std::__cxx11::string::operator=((string *)(value.field_2._M_local_buf + 8),"IMPORTED_SONAME");
      cmGeneratorTarget::GetSOName((string *)&iface,target,config);
      std::__cxx11::string::operator+=(local_78,(string *)&iface);
      std::__cxx11::string::~string((string *)&iface);
    }
    else {
      std::__cxx11::string::operator=
                ((string *)(value.field_2._M_local_buf + 8),"IMPORTED_NO_SONAME");
      std::__cxx11::string::operator=(local_78,"TRUE");
    }
    std::__cxx11::string::operator+=((string *)(value.field_2._M_local_buf + 8),(string *)suffix);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)((long)&value.field_2 + 8));
    std::__cxx11::string::operator=((string *)pmVar4,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  }
  local_f8 = cmGeneratorTarget::GetLinkInterface(target,config,target);
  if (local_f8 != (cmLinkInterface *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"IMPORTED_LINK_INTERFACE_LANGUAGES",
               (allocator<char> *)((long)&oldMissingTargetsSize + 7));
    SetImportLinkProperty<std::__cxx11::string>
              (this,suffix,target,&local_118,&local_f8->Languages,properties,No);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)((long)&oldMissingTargetsSize + 7));
    local_128 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->MissingTargets);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"IMPORTED_LINK_DEPENDENT_LIBRARIES",
               (allocator<char> *)(prop_1.field_2._M_local_buf + 0xf));
    SetImportLinkProperty<cmLinkItem>
              (this,suffix,target,&local_148,&local_f8->SharedDeps,properties,Yes);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)(prop_1.field_2._M_local_buf + 0xf));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&this->MissingTargets,local_128);
    if (local_f8->Multiplicity != 0) {
      cmAlphaNum::cmAlphaNum(&local_1a0,"IMPORTED_LINK_INTERFACE_MULTIPLICITY");
      cmAlphaNum::cmAlphaNum(&local_1d0,suffix);
      cmStrCat<>((string *)local_170,&local_1a0,&local_1d0);
      std::__cxx11::to_string((string *)((long)&prop_2.field_2 + 8),local_f8->Multiplicity);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](properties,(key_type *)local_170);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)(prop_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(prop_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_170);
    }
  }
  MVar3 = cmGeneratorTarget::GetManagedType(target,config);
  if (MVar3 != Native) {
    cmAlphaNum::cmAlphaNum(&local_240,"IMPORTED_COMMON_LANGUAGE_RUNTIME");
    this_00 = (cmAlphaNum *)((long)&propval.field_2 + 8);
    cmAlphaNum::cmAlphaNum(this_00,suffix);
    cmStrCat<>((string *)local_210,&local_240,this_00);
    std::__cxx11::string::string((string *)&p);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"COMMON_LANGUAGE_RUNTIME",&local_2b9);
    local_298 = cmGeneratorTarget::GetProperty(target,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    bVar1 = cmValue::operator_cast_to_bool(&local_298);
    if (bVar1) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_298);
      std::__cxx11::string::operator=((string *)&p,(string *)psVar5);
    }
    else {
      bVar1 = cmGeneratorTarget::IsCSharpOnly(target);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&p,"CSharp");
      }
    }
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](properties,(key_type *)local_210);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&p);
    std::__cxx11::string::~string((string *)&p);
    std::__cxx11::string::~string((string *)local_210);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportDetailProperties(
  const std::string& config, std::string const& suffix,
  cmGeneratorTarget* target, ImportPropertyMap& properties)
{
  // Get the makefile in which to lookup target information.
  cmMakefile* mf = target->Makefile;

  // Add the soname for unix shared libraries.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY ||
      target->GetType() == cmStateEnums::MODULE_LIBRARY) {
    if (!target->IsDLLPlatform()) {
      std::string prop;
      std::string value;
      if (target->HasSOName(config)) {
        if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
          value = this->InstallNameDir(target, config);
        }
        prop = "IMPORTED_SONAME";
        value += target->GetSOName(config);
      } else {
        prop = "IMPORTED_NO_SONAME";
        value = "TRUE";
      }
      prop += suffix;
      properties[prop] = value;
    }
  }

  // Add the transitive link dependencies for this configuration.
  if (cmLinkInterface const* iface =
        target->GetLinkInterface(config, target)) {
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_INTERFACE_LANGUAGES", iface->Languages,
      properties, ImportLinkPropertyTargetNames::No);

    // Export IMPORTED_LINK_DEPENDENT_LIBRARIES to help consuming linkers
    // find private dependencies of shared libraries.
    std::size_t oldMissingTargetsSize = this->MissingTargets.size();
    this->SetImportLinkProperty(
      suffix, target, "IMPORTED_LINK_DEPENDENT_LIBRARIES", iface->SharedDeps,
      properties, ImportLinkPropertyTargetNames::Yes);
    // Avoid enforcing shared library private dependencies as public package
    // dependencies by ignoring missing targets added for them.
    this->MissingTargets.resize(oldMissingTargetsSize);

    if (iface->Multiplicity > 0) {
      std::string prop =
        cmStrCat("IMPORTED_LINK_INTERFACE_MULTIPLICITY", suffix);
      properties[prop] = std::to_string(iface->Multiplicity);
    }
  }

  // Add information if this target is a managed target
  if (target->GetManagedType(config) !=
      cmGeneratorTarget::ManagedType::Native) {
    std::string prop = cmStrCat("IMPORTED_COMMON_LANGUAGE_RUNTIME", suffix);
    std::string propval;
    if (cmValue p = target->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
      propval = *p;
    } else if (target->IsCSharpOnly()) {
      // C# projects do not have the /clr flag, so we set the property
      // here to mark the target as (only) managed (i.e. no .lib file
      // to link to). Otherwise the  COMMON_LANGUAGE_RUNTIME target
      // property would have to be set manually for C# targets to make
      // exporting/importing work.
      propval = "CSharp";
    }
    properties[prop] = propval;
  }
}